

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O1

int X509_NAME_get_index_by_OBJ(X509_NAME *name,ASN1_OBJECT *obj,int lastpos)

{
  OPENSSL_STACK *sk;
  int iVar1;
  size_t sVar2;
  undefined8 *puVar3;
  int iVar4;
  ulong uVar5;
  ulong i;
  
  if (name == (X509_NAME *)0x0) {
LAB_002acf4b:
    iVar4 = -1;
  }
  else {
    sk = (OPENSSL_STACK *)name->entries;
    sVar2 = OPENSSL_sk_num(sk);
    if (lastpos < 0) {
      lastpos = 0xffffffff;
    }
    uVar5 = (ulong)(uint)lastpos;
    i = (ulong)lastpos;
    do {
      i = i + 1;
      if ((long)(int)sVar2 <= (long)i) goto LAB_002acf4b;
      puVar3 = (undefined8 *)OPENSSL_sk_value(sk,i);
      iVar1 = OBJ_cmp((ASN1_OBJECT *)*puVar3,obj);
      if (iVar1 == 0) {
        uVar5 = i & 0xffffffff;
      }
      iVar4 = (int)uVar5;
    } while (iVar1 != 0);
  }
  return iVar4;
}

Assistant:

int X509_NAME_get_index_by_OBJ(const X509_NAME *name, const ASN1_OBJECT *obj,
                               int lastpos) {
  if (name == NULL) {
    return -1;
  }
  if (lastpos < 0) {
    lastpos = -1;
  }
  const STACK_OF(X509_NAME_ENTRY) *sk = name->entries;
  int n = (int)sk_X509_NAME_ENTRY_num(sk);
  for (lastpos++; lastpos < n; lastpos++) {
    const X509_NAME_ENTRY *ne = sk_X509_NAME_ENTRY_value(sk, lastpos);
    if (OBJ_cmp(ne->object, obj) == 0) {
      return lastpos;
    }
  }
  return -1;
}